

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O3

int __thiscall
qclab::qgates::Phase<std::complex<float>_>::toQASM
          (Phase<std::complex<float>_> *this,ostream *stream,int offset)

{
  int iVar1;
  float angle;
  __string_type local_38;
  
  iVar1 = (this->super_QGate1<std::complex<float>_>).qubit_;
  angle = atan2f((this->angle_).sin_,(this->angle_).cos_);
  qasm1<float>(&local_38,"rz",offset + iVar1,angle);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_38._M_dataplus._M_p,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          stream << qasmRz( this->qubit_ + offset , theta() ) ;
          return 0 ;
        }